

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  ulong uVar2;
  UnitTest *pUVar3;
  char *pcVar4;
  string *psVar5;
  string *in_RDI;
  string local_288 [32];
  FilePath local_268;
  undefined1 local_248 [8];
  FilePath result;
  string local_220;
  FilePath local_200;
  allocator local_1d9;
  string local_1d8;
  FilePath local_1b8;
  FilePath local_198;
  allocator local_171;
  string local_170;
  undefined1 local_150 [8];
  FilePath output_name;
  string local_128;
  FilePath local_108;
  allocator local_e1;
  string local_e0;
  FilePath local_c0;
  FilePath local_a0;
  char *local_80;
  char *colon;
  string local_70 [32];
  string local_50 [8];
  string format;
  allocator local_19;
  char *local_18;
  char *gtest_output_flag;
  
  local_18 = (char *)std::__cxx11::string::c_str();
  if (local_18 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    GetOutputFormat_abi_cxx11_();
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"xml",(allocator *)((long)&colon + 7));
      std::__cxx11::string::operator=(local_50,local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)((long)&colon + 7));
    }
    local_80 = strchr(local_18,0x3a);
    if (local_80 == (char *)0x0) {
      pUVar3 = UnitTest::GetInstance();
      pcVar4 = UnitTest::original_working_dir(pUVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,pcVar4,&local_e1);
      FilePath::FilePath(&local_c0,&local_e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_128,"test_detail",
                 (allocator *)(output_name.pathname_.field_2._M_local_buf + 0xf));
      FilePath::FilePath(&local_108,&local_128);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      FilePath::MakeFileName(&local_a0,&local_c0,&local_108,0,pcVar4);
      psVar5 = FilePath::string_abi_cxx11_(&local_a0);
      std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
      FilePath::~FilePath(&local_a0);
      FilePath::~FilePath(&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator
                ((allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
      FilePath::~FilePath(&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      output_name.pathname_.field_2._8_4_ = 1;
    }
    else {
      pcVar4 = local_80 + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,pcVar4,&local_171);
      FilePath::FilePath((FilePath *)local_150,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      bVar1 = FilePath::IsAbsolutePath((FilePath *)local_150);
      if (!bVar1) {
        pUVar3 = UnitTest::GetInstance();
        pcVar4 = UnitTest::original_working_dir(pUVar3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1d8,pcVar4,&local_1d9);
        FilePath::FilePath(&local_1b8,&local_1d8);
        pcVar4 = local_80 + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_220,pcVar4,
                   (allocator *)(result.pathname_.field_2._M_local_buf + 0xf));
        FilePath::FilePath(&local_200,&local_220);
        FilePath::ConcatPaths(&local_198,&local_1b8,&local_200);
        FilePath::operator=((FilePath *)local_150,&local_198);
        FilePath::~FilePath(&local_198);
        FilePath::~FilePath(&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(result.pathname_.field_2._M_local_buf + 0xf));
        FilePath::~FilePath(&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      }
      bVar1 = FilePath::IsDirectory((FilePath *)local_150);
      if (bVar1) {
        GetCurrentExecutableName();
        GetOutputFormat_abi_cxx11_();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        FilePath::GenerateUniqueFileName
                  ((FilePath *)local_248,(FilePath *)local_150,&local_268,pcVar4);
        std::__cxx11::string::~string(local_288);
        FilePath::~FilePath(&local_268);
        psVar5 = FilePath::string_abi_cxx11_((FilePath *)local_248);
        std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
        output_name.pathname_.field_2._8_4_ = 1;
        FilePath::~FilePath((FilePath *)local_248);
      }
      else {
        psVar5 = FilePath::string_abi_cxx11_((FilePath *)local_150);
        std::__cxx11::string::string((string *)in_RDI,(string *)psVar5);
        output_name.pathname_.field_2._8_4_ = 1;
      }
      FilePath::~FilePath((FilePath *)local_150);
    }
    std::__cxx11::string::~string(local_50);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return "";

  std::string format = GetOutputFormat();
  if (format.empty())
    format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return internal::FilePath::MakeFileName(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile), 0,
        format.c_str()).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}